

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

SnapShot * TTD::SnapShot::ParseSnapshotFromFile(FileReader *reader)

{
  SnapHandler *pSVar1;
  SnapType *pSVar2;
  UnorderedArrayListLink *pUVar3;
  UnorderedArrayListLink *pUVar4;
  uint32 uVar5;
  int iVar6;
  HeapAllocator *this;
  SnapShot *pSVar7;
  SnapContext *intoCtx;
  int *piVar8;
  TTD_LOG_PTR_ID TVar9;
  UnorderedArrayListLink *pUVar10;
  UnorderedArrayListLink *pUVar11;
  FunctionBodyResolveInfo *fbInfo;
  SnapObject *snpObject;
  UnorderedArrayListLink **ppUVar12;
  UnorderedArrayListLink **ppUVar13;
  uint32 i;
  uint32 uVar14;
  SnapHandler *pSVar15;
  SnapType *pSVar16;
  uint32 i_1;
  SnapHandler *pSVar17;
  SnapType *pSVar18;
  undefined1 local_88 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> handlerMap;
  SnapType *local_60;
  SnapShot *local_58;
  undefined1 local_50 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> typeMap;
  
  (*reader->_vptr_FileReader[6])(reader,0);
  FileReader::ReadDouble(reader,timeTotal,false);
  FileReader::ReadUInt64(reader,usedMemory,true);
  FileReader::ReadUInt64(reader,reservedMemory,true);
  FileReader::ReadDouble(reader,timeGC,true);
  FileReader::ReadDouble(reader,timeMark,true);
  FileReader::ReadDouble(reader,timeExtract,true);
  local_88 = (undefined1  [8])&typeinfo;
  handlerMap.m_h1Prime = 0;
  handlerMap.m_h2Prime = 0;
  handlerMap.m_capacity = 0xffffffff;
  handlerMap._12_4_ = 0xffffffff;
  handlerMap.m_hashArray = (Entry *)anon_var_dwarf_41f0bd1;
  handlerMap.m_count = 0x71;
  this = Memory::HeapAllocator::TrackAllocInfo
                   (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_88);
  pSVar7 = (SnapShot *)Memory::HeapAllocator::AllocT<true>(this,0x1f8);
  SnapShot(pSVar7,0.0);
  pSVar7 = TTD_MEM_ALLOC_CHECK<TTD::SnapShot>(pSVar7);
  uVar5 = FileReader::ReadLengthValue(reader,true);
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
    intoCtx = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
                        (&pSVar7->m_ctxList);
    NSSnapValues::ParseSnapContext(intoCtx,uVar14 != 0,reader,&pSVar7->m_slabAllocator);
  }
  (*reader->_vptr_FileReader[5])(reader);
  uVar5 = FileReader::ReadLengthValue(reader,true);
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  local_58 = pSVar7;
  for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
    piVar8 = UnorderedArrayList<int,_32UL>::NextOpenEntry
                       (&pSVar7->m_tcSymbolRegistrationMapContents);
    iVar6 = (*reader->_vptr_FileReader[0xc])(reader,(ulong)(uVar14 != 0));
    *piVar8 = iVar6;
  }
  (*reader->_vptr_FileReader[5])(reader);
  TVar9 = FileReader::ReadLogTag(reader,ctxTag,true);
  pSVar7 = local_58;
  local_58->m_activeScriptContext = TVar9;
  ParseListHelper<void(*)(TTD::NSSnapValues::SnapRootInfoEntry*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SnapRootInfoEntry,512ul>
            (SnapRootPinEntryParse,&local_58->m_rootList,reader,&local_58->m_slabAllocator);
  ParseListHelper<void(*)(TTD::NSSnapType::SnapHandler*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapType::SnapHandler,2048ul>
            (NSSnapType::ParseSnapHandler,&pSVar7->m_handlerList,reader,&pSVar7->m_slabAllocator);
  local_88 = (undefined1  [8])0x0;
  handlerMap._0_8_ = handlerMap._0_8_ & 0xffffffff00000000;
  handlerMap.m_capacity = 0;
  handlerMap._12_4_ = 0;
  handlerMap.m_hashArray = (Entry *)((ulong)handlerMap.m_hashArray & 0xffffffff00000000);
  uVar5 = UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Count(&pSVar7->m_handlerList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)local_88,
             uVar5);
  pSVar15 = (pSVar7->m_handlerList).m_inlineHeadBlock.CurrPos;
  pSVar1 = (pSVar7->m_handlerList).m_inlineHeadBlock.BlockData;
  ppUVar12 = &(pSVar7->m_handlerList).m_inlineHeadBlock.Next;
  pSVar17 = (SnapHandler *)0x0;
  if (pSVar1 != pSVar15) {
    pSVar17 = pSVar1;
  }
  do {
    pUVar3 = *ppUVar12;
    do {
      do {
        pUVar10 = pUVar3;
        if (pSVar17 == (SnapHandler *)0x0) {
          ParseListHelper_WMap<void(*)(TTD::NSSnapType::SnapType*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>const&),TTD::NSSnapType::SnapType,TTD::NSSnapType::SnapHandler*,2048ul>
                    (NSSnapType::ParseSnapType,&pSVar7->m_typeList,reader,&pSVar7->m_slabAllocator,
                     (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)
                     local_88);
          local_50 = (undefined1  [8])0x0;
          typeMap.m_h1Prime = 0;
          typeMap.m_capacity = 0;
          typeMap._12_4_ = 0;
          typeMap.m_hashArray._0_4_ = 0;
          uVar5 = UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::Count(&pSVar7->m_typeList);
          TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Initialize
                    ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)local_50
                     ,uVar5);
          pSVar16 = (pSVar7->m_typeList).m_inlineHeadBlock.CurrPos;
          pSVar2 = (pSVar7->m_typeList).m_inlineHeadBlock.BlockData;
          ppUVar13 = &(pSVar7->m_typeList).m_inlineHeadBlock.Next;
          pSVar18 = (SnapType *)0x0;
          if (pSVar2 != pSVar16) {
            pSVar18 = pSVar2;
          }
          do {
            pUVar4 = *ppUVar13;
            do {
              do {
                pUVar11 = pUVar4;
                if (pSVar18 == (SnapType *)0x0) {
                  uVar5 = FileReader::ReadLengthValue(reader,true);
                  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
                  for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
                    fbInfo = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>
                             ::NextOpenEntry(&pSVar7->m_functionBodyList);
                    NSSnapValues::ParseFunctionBodyInfo
                              (fbInfo,uVar14 != 0,reader,&pSVar7->m_slabAllocator);
                  }
                  (*reader->_vptr_FileReader[5])(reader);
                  ParseListHelper_WMap<void(*)(TTD::NSSnapValues::SnapPrimitiveValue*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapType*>const&),TTD::NSSnapValues::SnapPrimitiveValue,TTD::NSSnapType::SnapType*,4096ul>
                            (NSSnapValues::ParseSnapPrimitiveValue,&pSVar7->m_primitiveObjectList,
                             reader,&pSVar7->m_slabAllocator,
                             (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
                             local_50);
                  uVar5 = FileReader::ReadLengthValue(reader,true);
                  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
                  for (uVar14 = 0; uVar5 != uVar14; uVar14 = uVar14 + 1) {
                    snpObject = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::
                                NextOpenEntry(&pSVar7->m_compoundObjectList);
                    NSSnapObjects::ParseObject
                              (snpObject,uVar14 != 0,reader,&pSVar7->m_slabAllocator,
                               pSVar7->m_snapObjectVTableArray,
                               (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>
                                *)local_50);
                  }
                  (*reader->_vptr_FileReader[5])(reader);
                  ParseListHelper<void(*)(TTD::NSSnapValues::ScriptFunctionScopeInfo*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::ScriptFunctionScopeInfo,2048ul>
                            (NSSnapValues::ParseScriptFunctionScopeInfo,&pSVar7->m_scopeEntries,
                             reader,&pSVar7->m_slabAllocator);
                  ParseListHelper<void(*)(TTD::NSSnapValues::SlotArrayInfo*,bool,TTD::FileReader*,TTD::SlabAllocatorBase<0>&),TTD::NSSnapValues::SlotArrayInfo,2048ul>
                            (NSSnapValues::ParseSlotArrayInfo,&pSVar7->m_slotArrayEntries,reader,
                             &pSVar7->m_slabAllocator);
                  FileReader::ReadDouble(reader,timeWrite,true);
                  (*reader->_vptr_FileReader[7])(reader);
                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::
                  ~TTDIdentifierDictionary
                            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
                             local_50);
                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::
                  ~TTDIdentifierDictionary
                            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>
                              *)local_88);
                  return pSVar7;
                }
                local_60 = pSVar18;
                TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::AddItem
                          ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *)
                           local_50,pSVar18->TypePtrId,&local_60);
                pSVar18 = pSVar18 + 1;
                pUVar4 = pUVar11;
              } while (pSVar18 != pSVar16);
              pSVar18 = (SnapType *)0x0;
              pUVar4 = (UnorderedArrayListLink *)0x0;
            } while (pUVar11 == (UnorderedArrayListLink *)0x0);
            pSVar16 = pUVar11->CurrPos;
            pSVar18 = pUVar11->BlockData;
            ppUVar13 = &pUVar11->Next;
          } while( true );
        }
        local_50 = (undefined1  [8])pSVar17;
        TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::AddItem
                  ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *)
                   local_88,pSVar17->HandlerId,(SnapHandler **)local_50);
        pSVar17 = pSVar17 + 1;
        pUVar3 = pUVar10;
      } while (pSVar17 != pSVar15);
      pSVar17 = (SnapHandler *)0x0;
      pUVar3 = (UnorderedArrayListLink *)0x0;
    } while (pUVar10 == (UnorderedArrayListLink *)0x0);
    pSVar15 = pUVar10->CurrPos;
    pSVar17 = pUVar10->BlockData;
    ppUVar12 = &pUVar10->Next;
  } while( true );
}

Assistant:

SnapShot* SnapShot::ParseSnapshotFromFile(FileReader* reader)
    {
        reader->ReadRecordStart();

        reader->ReadDouble(NSTokens::Key::timeTotal);
        reader->ReadUInt64(NSTokens::Key::usedMemory, true);
        reader->ReadUInt64(NSTokens::Key::reservedMemory, true);
        reader->ReadDouble(NSTokens::Key::timeGC, true);
        reader->ReadDouble(NSTokens::Key::timeMark, true);
        reader->ReadDouble(NSTokens::Key::timeExtract, true);

        SnapShot* snap = TT_HEAP_NEW(SnapShot, 0.0);

        uint32 ctxCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < ctxCount; ++i)
        {
            NSSnapValues::SnapContext* snpCtx = snap->m_ctxList.NextOpenEntry();
            NSSnapValues::ParseSnapContext(snpCtx, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        uint32 tcSymbolCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < tcSymbolCount; ++i)
        {
            Js::PropertyId* symid = snap->m_tcSymbolRegistrationMapContents.NextOpenEntry();
            *symid = reader->ReadNakedUInt32(i != 0);
        }
        reader->ReadSequenceEnd();

        snap->m_activeScriptContext = reader->ReadLogTag(NSTokens::Key::ctxTag, true);
        SnapShot::ParseListHelper(&SnapShot::SnapRootPinEntryParse, snap->m_rootList, reader, snap->GetSnapshotSlabAllocator());

        ////

        SnapShot::ParseListHelper(&NSSnapType::ParseSnapHandler, snap->m_handlerList, reader, snap->GetSnapshotSlabAllocator());

        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapHandler*> handlerMap;
        handlerMap.Initialize(snap->m_handlerList.Count());
        for(auto iter = snap->m_handlerList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            handlerMap.AddItem(iter.Current()->HandlerId, iter.Current());
        }

        SnapShot::ParseListHelper_WMap(&NSSnapType::ParseSnapType, snap->m_typeList, reader, snap->GetSnapshotSlabAllocator(), handlerMap);
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*> typeMap;
        typeMap.Initialize(snap->m_typeList.Count());

        for(auto iter = snap->m_typeList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            typeMap.AddItem(iter.Current()->TypePtrId, iter.Current());
        }

        ////
        uint32 bodyCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < bodyCount; ++i)
        {
            NSSnapValues::FunctionBodyResolveInfo* into = snap->m_functionBodyList.NextOpenEntry();
            NSSnapValues::ParseFunctionBodyInfo(into, i != 0, reader, snap->GetSnapshotSlabAllocator());
        }
        reader->ReadSequenceEnd();

        SnapShot::ParseListHelper_WMap(&NSSnapValues::ParseSnapPrimitiveValue, snap->m_primitiveObjectList, reader, snap->GetSnapshotSlabAllocator(), typeMap);

        uint32 objCount = reader->ReadLengthValue(true);
        reader->ReadSequenceStart_WDefaultKey(true);
        for(uint32 i = 0; i < objCount; ++i)
        {
            NSSnapObjects::SnapObject* into = snap->m_compoundObjectList.NextOpenEntry();
            NSSnapObjects::ParseObject(into, i != 0, reader, snap->GetSnapshotSlabAllocator(), snap->m_snapObjectVTableArray, typeMap);
        }
        reader->ReadSequenceEnd();

        ////
        SnapShot::ParseListHelper(&NSSnapValues::ParseScriptFunctionScopeInfo, snap->m_scopeEntries, reader, snap->GetSnapshotSlabAllocator());
        SnapShot::ParseListHelper(&NSSnapValues::ParseSlotArrayInfo, snap->m_slotArrayEntries, reader, snap->GetSnapshotSlabAllocator());

        reader->ReadDouble(NSTokens::Key::timeWrite, true);

        reader->ReadRecordEnd();

        return snap;
    }